

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O1

bool __thiscall PSEngine::basic_movement_resolution(PSEngine *this)

{
  long lVar1;
  element_type *peVar2;
  pointer pOVar3;
  pointer pwVar4;
  _Rb_tree_header *p_Var5;
  int iVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  _Rb_tree_node_base *p_Var9;
  pointer pCVar10;
  _Base_ptr p_Var11;
  element_type *peVar12;
  int iVar13;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *__range2;
  pointer pCVar14;
  element_type *peVar15;
  pointer pCVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  int iVar18;
  ObjectMoveInfo *elem;
  pointer __x;
  pointer pwVar19;
  bool bVar20;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
  pVar21;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> current_cell_objects_to_move;
  ObjectMoveInfo move_info;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> objects_to_move;
  vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> local_168;
  undefined1 local_148 [8];
  undefined1 auStack_140 [56];
  element_type *local_108 [2];
  undefined1 local_f8 [24];
  pointer pwStack_e0;
  undefined8 local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_f8._16_8_ = (pointer)0x0;
  pwStack_e0 = (pointer)0x0;
  local_d8 = 0;
  pCVar14 = (this->m_current_level).cells.
            super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
            super__Vector_impl_data._M_start;
  auStack_140._40_8_ =
       (this->m_current_level).cells.
       super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pCVar14 != (pointer)auStack_140._40_8_) {
    do {
      local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (value_type *)0x0;
      local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (value_type *)0x0;
      local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var7 = (pCVar14->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var9 = &(pCVar14->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      iVar18 = 4;
      p_Var5 = (_Rb_tree_header *)p_Var9;
      if (p_Var7 != p_Var9) {
        do {
          auStack_140._48_8_ = p_Var5;
          iVar18 = *(int *)&p_Var7[1]._M_left;
          if (iVar18 == 0) {
            iVar18 = 5;
            if ((int)(this->m_config).log_verbosity < 5) {
              peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              local_108[0] = (element_type *)local_f8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_108,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                         m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                         m_engine_log_cat_abi_cxx11_._M_string_length);
              local_d0[0] = local_c0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d0,
                         "an objec move type is set to none, this should never happen","");
              (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_108,(string *)local_d0);
              if (local_d0[0] != local_c0) {
                operator_delete(local_d0[0],local_c0[0] + 1);
              }
              if (local_108[0] != (element_type *)local_f8) {
                operator_delete(local_108[0],
                                (ulong)((long)&((__weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                                 *)local_f8._0_8_)->_M_ptr + 1));
              }
              p_Var9 = (_Rb_tree_node_base *)auStack_140._48_8_;
              if ((this->m_config).log_operation_history_after_error == true) {
                print_operation_history(this);
              }
            }
            goto LAB_0011759e;
          }
          if (iVar18 == 6) {
LAB_0011759b:
            iVar18 = 0;
          }
          else {
            if (iVar18 == 5) {
              *(undefined4 *)&p_Var7[1]._M_left = 6;
              goto LAB_0011759b;
            }
            auStack_140._16_8_ = (element_type *)0x0;
            auStack_140._0_4_ = 0;
            auStack_140._4_4_ = 0;
            local_148 = *(undefined1 (*) [8])&pCVar14->position;
            auStack_140._8_8_ = *(undefined8 *)(p_Var7 + 1);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_140 + 0x10),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var7[1]._M_parent);
            bVar20 = get_move_destination_coord
                               (this,pCVar14->position,*(ObjectMoveType *)&p_Var7[1]._M_left,
                                (PSVector2i *)auStack_140);
            if (bVar20) {
              std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::push_back
                        (&local_168,(value_type *)local_148);
              if ((element_type *)auStack_140._16_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_140._16_8_);
              }
              iVar18 = 1;
              if (bVar20) goto LAB_0011759b;
            }
            else {
              if ((element_type *)auStack_140._16_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_140._16_8_);
              }
              iVar18 = 1;
            }
          }
LAB_0011759e:
          if ((iVar18 != 5) && (iVar18 != 0)) goto LAB_0011773c;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          p_Var5 = (_Rb_tree_header *)auStack_140._48_8_;
        } while (p_Var7 != p_Var9);
        iVar18 = 4;
      }
LAB_0011773c:
      pOVar3 = local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if ((iVar18 == 4) &&
         (iVar18 = 0,
         local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        __x = local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
        do {
          pVar21 = std::
                   _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                   ::equal_range(&(pCVar14->objects)._M_t,&__x->obj);
          std::
          _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
          ::_M_erase_aux(&(pCVar14->objects)._M_t,(_Base_ptr)pVar21.first._M_node,
                         (_Base_ptr)pVar21.second._M_node);
          std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::push_back
                    ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)(local_f8 + 0x10),
                     __x);
          __x = __x + 1;
        } while (__x != pOVar3);
      }
      std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector(&local_168);
      if (iVar18 != 0) goto LAB_00117c0e;
      pCVar14 = pCVar14 + 1;
    } while (pCVar14 != (pointer)auStack_140._40_8_);
  }
  pwVar4 = pwStack_e0;
  if ((pointer)local_f8._16_8_ == pwStack_e0) {
LAB_001178c6:
    pCVar16 = (this->m_current_level).cells.
              super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar10 = (this->m_current_level).cells.
              super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar8 = CONCAT71((int7)((ulong)pCVar14 >> 8),pCVar16 == pCVar10);
    if (pCVar16 != pCVar10) {
      auStack_140._40_8_ = pCVar10;
      do {
        iVar18 = 0xb;
        if (1 < (pCVar16->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          auStack_140._48_4_ = (int)uVar8;
          auStack_140._0_8_ = auStack_140._0_8_ & 0xffffffff00000000;
          iVar18 = 0;
          auStack_140._8_8_ = (element_type *)0x0;
          auStack_140._32_8_ = 0;
          auStack_140._16_8_ = (element_type *)auStack_140;
          auStack_140._24_8_ = (element_type *)auStack_140;
          for (p_Var9 = (pCVar16->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var9 != &(pCVar16->objects)._M_t._M_impl.super__Rb_tree_header;
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
            lVar1 = *(long *)(p_Var9 + 1);
            p_Var17 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x40);
            if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar6 = p_Var17->_M_use_count;
              do {
                if (iVar6 == 0) {
                  p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  break;
                }
                LOCK();
                iVar13 = p_Var17->_M_use_count;
                bVar20 = iVar6 == iVar13;
                if (bVar20) {
                  p_Var17->_M_use_count = iVar6 + 1;
                  iVar13 = iVar6;
                }
                iVar6 = iVar13;
                UNLOCK();
              } while (!bVar20);
            }
            if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar20 = true;
            }
            else {
              bVar20 = p_Var17->_M_use_count == 0;
            }
            peVar12 = (element_type *)auStack_140;
            peVar15 = (element_type *)auStack_140._8_8_;
            if (bVar20) {
              uVar8 = 0;
            }
            else {
              uVar8 = *(ulong *)(lVar1 + 0x38);
            }
            for (; peVar15 != (element_type *)0x0;
                peVar15 = (element_type *)
                          (&(peVar15->super_Object).
                            super_enable_shared_from_this<CompiledGame::Object>._M_weak_this.
                            super___weak_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount)[bVar20]._M_pi) {
              bVar20 = (peVar15->super_Object).identifier._M_string_length < uVar8;
              if (!bVar20) {
                peVar12 = peVar15;
              }
            }
            peVar15 = (element_type *)auStack_140;
            if ((peVar12 != (element_type *)auStack_140) &&
               (peVar15 = peVar12, uVar8 < (peVar12->super_Object).identifier._M_string_length)) {
              peVar15 = (element_type *)auStack_140;
            }
            if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
            }
            if (peVar15 != (element_type *)auStack_140) {
              iVar18 = 1;
              break;
            }
            lVar1 = *(long *)(p_Var9 + 1);
            local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
            super__Vector_impl_data._M_finish = *(pointer *)(lVar1 + 0x40);
            if (local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish != (value_type *)0x0) {
              iVar6 = ((local_168.
                        super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
                        super__Vector_impl_data._M_finish)->destination).x;
              do {
                if (iVar6 == 0) {
                  local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
                  break;
                }
                LOCK();
                iVar13 = ((local_168.
                           super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->destination).x;
                bVar20 = iVar6 == iVar13;
                if (bVar20) {
                  ((local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->destination).x = iVar6 + 1;
                  iVar13 = iVar6;
                }
                iVar6 = iVar13;
                UNLOCK();
              } while (!bVar20);
            }
            if (local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish == (value_type *)0x0) {
              bVar20 = true;
            }
            else {
              bVar20 = ((local_168.
                         super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl
                         .super__Vector_impl_data._M_finish)->destination).x == 0;
            }
            if (bVar20) {
              local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
              super__Vector_impl_data._M_start = (value_type *)0x0;
            }
            else {
              local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl.
              super__Vector_impl_data._M_start = *(pointer *)(lVar1 + 0x38);
            }
            std::
            _Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,std::shared_ptr<CompiledGame::CollisionLayer>,std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>>,std::less<std::shared_ptr<CompiledGame::CollisionLayer>>,std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>>>
            ::_M_insert_unique<std::shared_ptr<CompiledGame::CollisionLayer>>
                      ((_Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,std::shared_ptr<CompiledGame::CollisionLayer>,std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>>,std::less<std::shared_ptr<CompiledGame::CollisionLayer>>,std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>>>
                        *)local_148,(shared_ptr<CompiledGame::CollisionLayer> *)&local_168);
            if (local_168.super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish != (value_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_168.
                         super__Vector_base<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>._M_impl
                         .super__Vector_impl_data._M_finish);
            }
          }
          std::
          _Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<CompiledGame::CollisionLayer>,_std::shared_ptr<CompiledGame::CollisionLayer>,_std::_Identity<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::less<std::shared_ptr<CompiledGame::CollisionLayer>_>,_std::allocator<std::shared_ptr<CompiledGame::CollisionLayer>_>_>
                       *)local_148);
          uVar8 = auStack_140._48_8_ & 0xffffffff;
          pCVar10 = (pointer)auStack_140._40_8_;
        }
        if ((iVar18 != 0xb) && (iVar18 != 0)) break;
        pCVar16 = pCVar16 + 1;
        uVar8 = CONCAT71((int7)(uVar8 >> 8),pCVar16 == pCVar10);
      } while (pCVar16 != pCVar10);
    }
  }
  else {
    pwVar19 = (pointer)local_f8._16_8_;
    while( true ) {
      p_Var17 = (pwVar19->super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount._M_pi;
      iVar18 = (this->m_current_level).size.x;
      iVar6 = (int)p_Var17;
      if ((iVar6 < 0 || iVar18 <= iVar6) || ((long)p_Var17 < 0)) {
        pCVar16 = (pointer)0x0;
      }
      else {
        pCVar16 = (pointer)0x0;
        iVar13 = (int)((ulong)p_Var17 >> 0x20);
        if (iVar13 < (this->m_current_level).size.y) {
          pCVar16 = (this->m_current_level).cells.
                    super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
                    super__Vector_impl_data._M_start + (iVar18 * iVar13 + iVar6);
        }
      }
      if (pCVar16 == (pointer)0x0) break;
      p_Var7 = (pCVar16->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &(pCVar16->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = &p_Var5->_M_header;
      if (p_Var7 != (_Base_ptr)0x0) {
        do {
          bVar20 = *(element_type **)(p_Var7 + 1) <
                   pwVar19[1].
                   super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (!bVar20) {
            p_Var11 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[bVar20];
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      p_Var7 = &p_Var5->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var5) &&
         (p_Var7 = p_Var11,
         pwVar19[1].super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         < *(element_type **)(p_Var11 + 1))) {
        p_Var7 = &p_Var5->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 != p_Var5) {
        if ((int)(this->m_config).log_verbosity < 5) {
          peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                     m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                     m_engine_log_cat_abi_cxx11_._M_string_length);
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b0,
                     "this object already exist in the destination cell, basic movement resolution cannot proceed."
                     ,"");
          (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_90,local_b0);
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          if ((this->m_config).log_operation_history_after_error == true) goto LAB_00117c06;
        }
        goto LAB_00117c0e;
      }
      local_148 = (undefined1  [8])
                  pwVar19[1].
                  super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auStack_140._0_8_ =
           pwVar19[1].super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((PSVector2i)auStack_140._0_8_ != (PSVector2i)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(auStack_140._0_8_ + 8) = *(_Atomic_word *)(auStack_140._0_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(auStack_140._0_8_ + 8) = *(_Atomic_word *)(auStack_140._0_8_ + 8) + 1;
        }
      }
      auStack_140._8_4_ = 6;
      std::
      _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
      ::
      _M_emplace_unique<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>>
                ((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
                  *)&pCVar16->objects,
                 (pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *)
                 local_148);
      if ((PSVector2i)auStack_140._0_8_ != (PSVector2i)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_140._0_8_);
      }
      pwVar19 = pwVar19 + 2;
      if (pwVar19 == pwVar4) goto LAB_001178c6;
    }
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                 m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                 m_engine_log_cat_abi_cxx11_._M_string_length);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"should not happen!","");
      (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_50,local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((this->m_config).log_operation_history_after_error != false) {
LAB_00117c06:
        print_operation_history(this);
      }
    }
LAB_00117c0e:
    uVar8 = 0;
  }
  std::vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_>::~vector
            ((vector<ObjectMoveInfo,_std::allocator<ObjectMoveInfo>_> *)(local_f8 + 0x10));
  return (bool)((byte)uVar8 & 1);
}

Assistant:

bool PSEngine::basic_movement_resolution()
{
    struct ObjectMoveInfo
    {
        PSVector2i origin;
        PSVector2i destination;

        shared_ptr<CompiledGame::PrimaryObject> obj;
    };

    vector<ObjectMoveInfo> objects_to_move;

    for(Cell& cell : m_current_level.cells)
    {
        vector<ObjectMoveInfo> current_cell_objects_to_move;

        for(auto& pair : cell.objects )
        {
            if(pair.second == ObjectMoveType::Action)
            {
                pair.second = ObjectMoveType::Stationary;
            }
            else if(pair.second != ObjectMoveType::Stationary)
            {
                if(pair.second == ObjectMoveType::None)
                {
                    PS_LOG_ERROR("an objec move type is set to none, this should never happen");
                    continue;
                }
                ObjectMoveInfo move_info;
                move_info.origin = cell.position;
                move_info.obj = pair.first;

                //if some movement is invalid, the whole basic movement resolution is invalid
                if( !get_move_destination_coord(cell.position,pair.second,move_info.destination))
                {
                    return false;
                }

                current_cell_objects_to_move.push_back(move_info);
            }
        }

        for(const auto& elem :current_cell_objects_to_move)
        {
            cell.objects.erase(elem.obj);

            objects_to_move.push_back(elem);
        }
    }

    for(const auto& move_info : objects_to_move)
    {
        //check if object is not already in cell
        Cell* dest_cell = get_cell_at(move_info.destination);

        if(dest_cell == nullptr)
        {
            PS_LOG_ERROR("should not happen!");
            return false;
        }

        if(dest_cell->objects.find(move_info.obj) != dest_cell->objects.end())
        {
            //moving objects were temporarily removed from the level so only static ones should be detected here
            PS_LOG_ERROR("this object already exist in the destination cell, basic movement resolution cannot proceed.");
            return false;
        }

        dest_cell->objects.insert(make_pair(move_info.obj, ObjectMoveType::Stationary));

    }

    //check if there's no collisions
    for(Cell& cell : m_current_level.cells)
    {
        if(cell.objects.size() <= 1)
        {
            continue;
        }

        set<shared_ptr<CompiledGame::CollisionLayer>> current_col_layers;

        for(auto& pair : cell.objects )
        {
            if( current_col_layers.count(pair.first->collision_layer.lock()) != 0)
            {
                return false; //collision was detected;
            }
            current_col_layers.insert(pair.first->collision_layer.lock());
        }
    }

    return true;
}